

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

int __thiscall
btGeneric6DofConstraint::setLinearLimits
          (btGeneric6DofConstraint *this,btConstraintInfo2 *info,int row,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  btScalar *pbVar4;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int rotAllowed;
  int indx2;
  int indx1;
  int flags;
  btVector3 axis;
  int i;
  btRotationalLimitMotor limot;
  btVector3 *in_stack_00000150;
  btVector3 *in_stack_00000158;
  btTransform *in_stack_00000160;
  btTransform *in_stack_00000168;
  btRotationalLimitMotor *in_stack_00000170;
  btGeneric6DofConstraint *in_stack_00000178;
  btVector3 *in_stack_00000190;
  btVector3 *in_stack_00000198;
  btConstraintInfo2 *in_stack_000001a0;
  int in_stack_000001a8;
  btVector3 *in_stack_000001b0;
  int in_stack_000001b8;
  int in_stack_000001c0;
  long in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  btScalar local_d4;
  btScalar local_d0;
  btScalar local_cc;
  int local_94;
  btRotationalLimitMotor local_90;
  int local_34;
  long local_30;
  
  local_34 = in_EDX;
  local_30 = in_RSI;
  btRotationalLimitMotor::btRotationalLimitMotor(&local_90);
  for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
    bVar1 = btTranslationalLimitMotor::needApplyForce
                      ((btTranslationalLimitMotor *)(in_RDI + 0x2c0),local_94);
    iVar3 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if (bVar1) {
      local_90.m_bounce = 0.0;
      local_90.m_currentLimit = *(int *)(in_RDI + 0x370 + (long)local_94 * 4);
      pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x360));
      local_90.m_currentPosition = pbVar4[local_94];
      pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x350));
      local_90.m_currentLimitError = pbVar4[local_94];
      local_90.m_damping = *(btScalar *)(in_RDI + 0x2f4);
      local_90.m_enableMotor = (bool)(*(byte *)(in_RDI + 0x32c + (long)local_94) & 1);
      pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2d0));
      local_90.m_hiLimit = pbVar4[local_94];
      local_90.m_limitSoftness = *(btScalar *)(in_RDI + 0x2f0);
      pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2c0));
      local_90.m_loLimit = pbVar4[local_94];
      local_90.m_maxLimitForce = 0.0;
      pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x340));
      local_90.m_maxMotorForce = pbVar4[local_94];
      pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x330));
      local_90.m_targetVelocity = pbVar4[local_94];
      btTransform::getBasis((btTransform *)(in_RDI + 0x440));
      btMatrix3x3::getColumn
                ((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),iVar3)
      ;
      uVar2 = *(int *)(in_RDI + 0x530) >> ((char)local_94 * '\x03' & 0x1fU);
      if ((uVar2 & 1) == 0) {
        local_cc = **(btScalar **)(local_30 + 0x38);
      }
      else {
        pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2fc));
        local_cc = pbVar4[local_94];
      }
      local_90.m_normalCFM = local_cc;
      if ((uVar2 & 2) == 0) {
        local_d0 = **(btScalar **)(local_30 + 0x38);
      }
      else {
        pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x31c));
        local_d0 = pbVar4[local_94];
      }
      local_90.m_stopCFM = local_d0;
      if ((uVar2 & 4) == 0) {
        local_d4 = *(btScalar *)(local_30 + 4);
      }
      else {
        pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x30c));
        local_d4 = pbVar4[local_94];
      }
      local_90.m_stopERP = local_d4;
      in_stack_fffffffffffffef8 = local_30;
      in_stack_ffffffffffffff00 = local_34;
      if ((*(byte *)(in_RDI + 0x52d) & 1) == 0) {
        iVar3 = get_limit_motor_info2
                          (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160,
                           in_stack_00000158,in_stack_00000150,in_stack_00000190,in_stack_00000198,
                           in_stack_000001a0,in_stack_000001a8,in_stack_000001b0,in_stack_000001b8,
                           in_stack_000001c0);
        local_34 = iVar3 + local_34;
      }
      else {
        iVar3 = get_limit_motor_info2
                          (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160,
                           in_stack_00000158,in_stack_00000150,in_stack_00000190,in_stack_00000198,
                           in_stack_000001a0,in_stack_000001a8,in_stack_000001b0,in_stack_000001b8,
                           in_stack_000001c0);
        local_34 = iVar3 + local_34;
      }
    }
  }
  return local_34;
}

Assistant:

int btGeneric6DofConstraint::setLinearLimits(btConstraintInfo2* info, int row, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
//	int row = 0;
	//solve linear limits
	btRotationalLimitMotor limot;
	for (int i=0;i<3 ;i++ )
	{
		if(m_linearLimits.needApplyForce(i))
		{ // re-use rotational motor code
			limot.m_bounce = btScalar(0.f);
			limot.m_currentLimit = m_linearLimits.m_currentLimit[i];
			limot.m_currentPosition = m_linearLimits.m_currentLinearDiff[i];
			limot.m_currentLimitError  = m_linearLimits.m_currentLimitError[i];
			limot.m_damping  = m_linearLimits.m_damping;
			limot.m_enableMotor  = m_linearLimits.m_enableMotor[i];
			limot.m_hiLimit  = m_linearLimits.m_upperLimit[i];
			limot.m_limitSoftness  = m_linearLimits.m_limitSoftness;
			limot.m_loLimit  = m_linearLimits.m_lowerLimit[i];
			limot.m_maxLimitForce  = btScalar(0.f);
			limot.m_maxMotorForce  = m_linearLimits.m_maxMotorForce[i];
			limot.m_targetVelocity  = m_linearLimits.m_targetVelocity[i];
			btVector3 axis = m_calculatedTransformA.getBasis().getColumn(i);
			int flags = m_flags >> (i * BT_6DOF_FLAGS_AXIS_SHIFT);
			limot.m_normalCFM	= (flags & BT_6DOF_FLAGS_CFM_NORM) ? m_linearLimits.m_normalCFM[i] : info->cfm[0];
			limot.m_stopCFM		= (flags & BT_6DOF_FLAGS_CFM_STOP) ? m_linearLimits.m_stopCFM[i] : info->cfm[0];
			limot.m_stopERP		= (flags & BT_6DOF_FLAGS_ERP_STOP) ? m_linearLimits.m_stopERP[i] : info->erp;
			if(m_useOffsetForConstraintFrame)
			{
				int indx1 = (i + 1) % 3;
				int indx2 = (i + 2) % 3;
				int rotAllowed = 1; // rotations around orthos to current axis
				if(m_angularLimits[indx1].m_currentLimit && m_angularLimits[indx2].m_currentLimit)
				{
					rotAllowed = 0;
				}
				row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0, rotAllowed);
			}
			else
			{
				row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0);
			}
		}
	}
	return row;
}